

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_connection.c
# Opt level: O0

uint8_t * parse_message(apx_serverConnection_t *self,uint8_t *begin,uint8_t *end,
                       apx_error_t *error_code)

{
  _Bool _Var1;
  apx_error_t aVar2;
  uint8_t *msg_data_00;
  uint8_t *msg_data;
  uint8_t *result;
  apx_serverConnection_t *paStack_38;
  uint32_t msg_size;
  uint8_t *msg_end;
  apx_error_t *error_code_local;
  uint8_t *end_local;
  uint8_t *begin_local;
  apx_serverConnection_t *self_local;
  
  paStack_38 = (apx_serverConnection_t *)0x0;
  *error_code = 0;
  if (begin < end) {
    result._4_4_ = 0;
    msg_end = (uint8_t *)error_code;
    error_code_local = (apx_error_t *)end;
    end_local = begin;
    begin_local = (uint8_t *)self;
    msg_data_00 = numheader_decode32(begin,end,(uint32_t *)((long)&result + 4));
    if (msg_data_00 == (uint8_t *)0x0) {
      msg_end[0] = '\x03';
      msg_end[1] = '\0';
      msg_end[2] = '\0';
      msg_end[3] = '\0';
      self_local = (apx_serverConnection_t *)0x0;
    }
    else if (msg_data_00 == end_local) {
      self_local = (apx_serverConnection_t *)end_local;
    }
    else {
      paStack_38 = (apx_serverConnection_t *)(msg_data_00 + result._4_4_);
      if (error_code_local < paStack_38) {
        self_local = (apx_serverConnection_t *)end_local;
      }
      else {
        if ((begin_local[0x438] & 1) == 0) {
          _Var1 = process_greeting_message(msg_data_00,result._4_4_,(apx_error_t *)msg_end);
          if (!_Var1) {
            return (uint8_t *)0x0;
          }
          apx_serverConnection_greeting_header_accepted_notification
                    ((apx_serverConnection_t *)begin_local);
        }
        else {
          aVar2 = apx_connectionBase_message_received
                            ((apx_connectionBase_t *)begin_local,msg_data_00,result._4_4_);
          *(apx_error_t *)msg_end = aVar2;
        }
        self_local = paStack_38;
      }
    }
  }
  else {
    *error_code = 3;
    self_local = (apx_serverConnection_t *)0x0;
  }
  return (uint8_t *)self_local;
}

Assistant:

static uint8_t const* parse_message(apx_serverConnection_t* self, uint8_t const* begin, uint8_t const* end, apx_error_t* error_code)
{
   uint8_t const* msg_end = NULL;
   *error_code = APX_NO_ERROR;
   if (begin < end)
   {
      uint32_t msg_size = 0u;
      uint8_t const* result = numheader_decode32(begin, end, &msg_size);
      if (result == NULL)
      {
         *error_code = APX_PARSE_ERROR;
         return NULL;
      }
      else if (result == begin)
      {
         //Not enough bytes in buffer, try later when more data has been received
         return begin;
      }
      else
      {
         uint8_t const* msg_data = result;
         msg_end = msg_data + msg_size;
#if APX_DEBUG_ENABLE
         apx_size_t const header_size = (apx_size_t)(msg_data - begin);
         printf("[SERVER-CONNECTION %d]: Received message: (%d+%d) bytes\n", (int)self->base.connection_id, (int)header_size, (int)msg_size);
#endif

         if (msg_end <= end)
         {
            if (self->is_greeting_accepted)
            {
               *error_code = apx_connectionBase_message_received(&self->base, msg_data, msg_size);
            }
            else
            {
               if (process_greeting_message(msg_data, msg_size, error_code))
               {
                  apx_serverConnection_greeting_header_accepted_notification(self);
               }
               else
               {
                  return NULL;
               }
            }
         }
         else
         {
            //Message not complete, try again later
            return begin;
         }
      }
   }
   else
   {
      *error_code = APX_PARSE_ERROR;
      return NULL;
   }
   return msg_end;
}